

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-avl.c
# Opt level: O0

pboolean p_tree_avl_insert(PTreeBaseNode **root_node,PCompareDataFunc compare_func,ppointer data,
                          PDestroyFunc key_destroy_func,PDestroyFunc value_destroy_func,ppointer key
                          ,ppointer value)

{
  pint pVar1;
  PTreeBaseNode_ *pPVar2;
  PTreeBaseNode *pPStack_50;
  pint cmp_result;
  PTreeBaseNode *parent_node;
  PTreeBaseNode **cur_node;
  ppointer key_local;
  PDestroyFunc value_destroy_func_local;
  PDestroyFunc key_destroy_func_local;
  ppointer data_local;
  PCompareDataFunc compare_func_local;
  PTreeBaseNode **root_node_local;
  
  pPStack_50 = *root_node;
  parent_node = (PTreeBaseNode *)root_node;
  while (parent_node->left != (PTreeBaseNode_ *)0x0) {
    pVar1 = (*compare_func)(key,parent_node->left->key,data);
    if (pVar1 < 0) {
      pPStack_50 = parent_node->left;
      parent_node = parent_node->left;
    }
    else {
      if (pVar1 < 1) break;
      pPStack_50 = parent_node->left;
      parent_node = (PTreeBaseNode *)&parent_node->left->right;
    }
  }
  if (parent_node->left == (PTreeBaseNode_ *)0x0) {
    pPVar2 = (PTreeBaseNode_ *)p_malloc0(0x30);
    parent_node->left = pPVar2;
    if (pPVar2 == (PTreeBaseNode_ *)0x0) {
      root_node_local._4_4_ = 0;
    }
    else {
      parent_node->left->key = key;
      parent_node->left->value = value;
      *(undefined4 *)&parent_node->left[1].right = 0;
      parent_node->left[1].left = pPStack_50;
      pp_tree_avl_balance_insert((PTreeAVLNode *)parent_node->left,root_node);
      root_node_local._4_4_ = 1;
    }
  }
  else {
    if (key_destroy_func != (PDestroyFunc)0x0) {
      (*key_destroy_func)(parent_node->left->key);
    }
    if (value_destroy_func != (PDestroyFunc)0x0) {
      (*value_destroy_func)(parent_node->left->value);
    }
    parent_node->left->key = key;
    parent_node->left->value = value;
    root_node_local._4_4_ = 0;
  }
  return root_node_local._4_4_;
}

Assistant:

pboolean
p_tree_avl_insert (PTreeBaseNode	**root_node,
		   PCompareDataFunc	compare_func,
		   ppointer		data,
		   PDestroyFunc		key_destroy_func,
		   PDestroyFunc		value_destroy_func,
		   ppointer		key,
		   ppointer		value)
{
	PTreeBaseNode	**cur_node;
	PTreeBaseNode	*parent_node;
	pint		cmp_result;

	cur_node    = root_node;
	parent_node = *root_node;

	/* Find where to insert the node */
	while (*cur_node != NULL) {
		cmp_result = compare_func (key, (*cur_node)->key, data);

		if (cmp_result < 0) {
			parent_node = *cur_node;
			cur_node    = &(*cur_node)->left;
		} else if (cmp_result > 0) {
			parent_node = *cur_node;
			cur_node    = &(*cur_node)->right;
		} else
			break;
	}

	/* If we have existing one - replace a key-value pair */
	if (*cur_node != NULL) {
		if (key_destroy_func != NULL)
			key_destroy_func ((*cur_node)->key);

		if (value_destroy_func != NULL)
			value_destroy_func ((*cur_node)->value);

		(*cur_node)->key   = key;
		(*cur_node)->value = value;

		return FALSE;
	}

	if (P_UNLIKELY ((*cur_node = p_malloc0 (sizeof (PTreeAVLNode))) == NULL))
		return FALSE;

	(*cur_node)->key   = key;
	(*cur_node)->value = value;

	((PTreeAVLNode *) *cur_node)->balance_factor = 0;
	((PTreeAVLNode *) *cur_node)->parent         = (PTreeAVLNode *) parent_node;

	/* Balance the tree */
	pp_tree_avl_balance_insert (((PTreeAVLNode *) *cur_node), root_node);

	return TRUE;
}